

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_table_filter.cpp
# Opt level: O2

unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> __thiscall
duckdb::TableFilter::Deserialize(TableFilter *this,Deserializer *deserializer)

{
  TableFilterType TVar1;
  SerializationException *this_00;
  allocator local_41;
  _Alloc_hider local_40;
  
  TVar1 = Deserializer::ReadProperty<duckdb::TableFilterType>(deserializer,100,"filter_type");
  this->_vptr_TableFilter = (_func_int **)0x0;
  switch(TVar1) {
  case CONSTANT_COMPARISON:
    ConstantFilter::Deserialize((ConstantFilter *)&stack0xffffffffffffffc0,deserializer);
    break;
  case IS_NULL:
    IsNullFilter::Deserialize((Deserializer *)&stack0xffffffffffffffc0);
    break;
  case IS_NOT_NULL:
    IsNotNullFilter::Deserialize((Deserializer *)&stack0xffffffffffffffc0);
    break;
  case CONJUNCTION_OR:
    ConjunctionOrFilter::Deserialize((ConjunctionOrFilter *)&stack0xffffffffffffffc0,deserializer);
    break;
  case CONJUNCTION_AND:
    ConjunctionAndFilter::Deserialize((ConjunctionAndFilter *)&stack0xffffffffffffffc0,deserializer)
    ;
    break;
  case STRUCT_EXTRACT:
    StructFilter::Deserialize((StructFilter *)&stack0xffffffffffffffc0,deserializer);
    break;
  case OPTIONAL_FILTER:
    OptionalFilter::Deserialize((OptionalFilter *)&stack0xffffffffffffffc0,deserializer);
    break;
  case IN_FILTER:
    InFilter::Deserialize((InFilter *)&stack0xffffffffffffffc0,deserializer);
    break;
  case DYNAMIC_FILTER:
    DynamicFilter::Deserialize((Deserializer *)&stack0xffffffffffffffc0);
    break;
  case EXPRESSION_FILTER:
    ExpressionFilter::Deserialize((ExpressionFilter *)&stack0xffffffffffffffc0,deserializer);
    break;
  default:
    this_00 = (SerializationException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&stack0xffffffffffffffc0,
               "Unsupported type for deserialization of TableFilter!",&local_41);
    SerializationException::SerializationException(this_00,(string *)&stack0xffffffffffffffc0);
    __cxa_throw(this_00,&SerializationException::typeinfo,::std::runtime_error::~runtime_error);
  }
  this->_vptr_TableFilter = (_func_int **)local_40._M_p;
  return (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>)
         (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>)this;
}

Assistant:

unique_ptr<TableFilter> TableFilter::Deserialize(Deserializer &deserializer) {
	auto filter_type = deserializer.ReadProperty<TableFilterType>(100, "filter_type");
	unique_ptr<TableFilter> result;
	switch (filter_type) {
	case TableFilterType::CONJUNCTION_AND:
		result = ConjunctionAndFilter::Deserialize(deserializer);
		break;
	case TableFilterType::CONJUNCTION_OR:
		result = ConjunctionOrFilter::Deserialize(deserializer);
		break;
	case TableFilterType::CONSTANT_COMPARISON:
		result = ConstantFilter::Deserialize(deserializer);
		break;
	case TableFilterType::DYNAMIC_FILTER:
		result = DynamicFilter::Deserialize(deserializer);
		break;
	case TableFilterType::EXPRESSION_FILTER:
		result = ExpressionFilter::Deserialize(deserializer);
		break;
	case TableFilterType::IN_FILTER:
		result = InFilter::Deserialize(deserializer);
		break;
	case TableFilterType::IS_NOT_NULL:
		result = IsNotNullFilter::Deserialize(deserializer);
		break;
	case TableFilterType::IS_NULL:
		result = IsNullFilter::Deserialize(deserializer);
		break;
	case TableFilterType::OPTIONAL_FILTER:
		result = OptionalFilter::Deserialize(deserializer);
		break;
	case TableFilterType::STRUCT_EXTRACT:
		result = StructFilter::Deserialize(deserializer);
		break;
	default:
		throw SerializationException("Unsupported type for deserialization of TableFilter!");
	}
	return result;
}